

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_record_file.c
# Opt level: O1

int playCallback(void *inputBuffer,void *outputBuffer,unsigned_long framesPerBuffer,
                PaStreamCallbackTimeInfo *timeInfo,PaStreamCallbackFlags statusFlags,void *userData)

{
  ring_buffer_size_t rVar1;
  long elementCount;
  
  rVar1 = PaUtil_GetRingBufferReadAvailable((PaUtilRingBuffer *)((long)userData + 0x10));
  elementCount = framesPerBuffer * 2;
  if (SBORROW8(rVar1,framesPerBuffer * 2) != (long)(rVar1 + framesPerBuffer * -2) < 0) {
    elementCount = rVar1;
  }
  rVar1 = PaUtil_ReadRingBuffer
                    ((PaUtilRingBuffer *)((long)userData + 0x10),outputBuffer,elementCount);
  *(int *)userData = *userData + (int)rVar1;
  return (int)(*(int *)((long)userData + 4) != 0);
}

Assistant:

static int playCallback( const void *inputBuffer, void *outputBuffer,
                         unsigned long framesPerBuffer,
                         const PaStreamCallbackTimeInfo* timeInfo,
                         PaStreamCallbackFlags statusFlags,
                         void *userData )
{
    paTestData *data = (paTestData*)userData;
    ring_buffer_size_t elementsToPlay = PaUtil_GetRingBufferReadAvailable(&data->ringBuffer);
    ring_buffer_size_t elementsToRead = min(elementsToPlay, (ring_buffer_size_t)(framesPerBuffer * NUM_CHANNELS));
    SAMPLE* wptr = (SAMPLE*)outputBuffer;

    (void) inputBuffer; /* Prevent unused variable warnings. */
    (void) timeInfo;
    (void) statusFlags;
    (void) userData;

    data->frameIndex += PaUtil_ReadRingBuffer(&data->ringBuffer, wptr, elementsToRead);

    return data->threadSyncFlag ? paComplete : paContinue;
}